

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

void mcpl_dump_header(mcpl_file_t f)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  char *pcVar4;
  mcpl_fileinternal_t *f_1;
  ulong uVar5;
  char *pcVar6;
  uint i;
  uint32_t ldata;
  char *data;
  
  puts("\n  Basic info");
  printf("    Format             : MCPL-%i\n",(ulong)*(uint *)((long)f.internal + 0x18));
  printf("    No. of particles   : %lu\n",*(undefined8 *)((long)f.internal + 0x40));
  printf("    Header storage     : %lu bytes\n",*(undefined8 *)((long)f.internal + 0x80));
  printf("    Data storage       : %lu bytes\n",
         (long)*(int *)((long)f.internal + 0x78) * *(long *)((long)f.internal + 0x40));
  puts("\n  Custom meta data");
  printf("    Source             : \"%s\"\n",*(undefined8 *)((long)f.internal + 0x10));
  uVar1 = *(uint *)((long)f.internal + 0x48);
  printf("    Number of comments : %i\n",(ulong)uVar1);
  for (i = 0; uVar1 != i; i = i + 1) {
    pcVar4 = mcpl_hdr_comment(f,i);
    printf("          -> comment %i : \"%s\"\n",(ulong)i,pcVar4);
  }
  uVar1 = *(uint *)((long)f.internal + 0x58);
  printf("    Number of blobs    : %i\n",(ulong)uVar1);
  lVar2 = *(long *)((long)f.internal + 0x60);
  uVar5 = 0;
  while( true ) {
    if (uVar1 == uVar5) {
      puts("\n  Particle data format");
      pcVar6 = "yes";
      pcVar4 = "yes";
      if (*(int *)((long)f.internal + 0x1c) == 0) {
        pcVar4 = "no";
      }
      printf("    User flags         : %s\n",pcVar4);
      if (*(int *)((long)f.internal + 0x20) == 0) {
        pcVar6 = "no";
      }
      printf("    Polarisation info  : %s\n",pcVar6);
      printf("    Fixed part. type   : ");
      if (*(int *)((long)f.internal + 0x28) == 0) {
        puts("no");
      }
      else {
        printf("yes (pdgcode %li)\n");
      }
      printf("    Fixed part. weight : ");
      if ((*(double *)((long)f.internal + 0x30) != 0.0) ||
         (NAN(*(double *)((long)f.internal + 0x30)))) {
        printf("yes (weight %g)\n");
      }
      else {
        puts("no");
      }
      pcVar4 = "single";
      if (*(int *)((long)f.internal + 0x24) == 0) {
        pcVar4 = "double";
      }
      printf("    FP precision       : %s\n",pcVar4);
      pcVar4 = "little";
      if (*(int *)((long)f.internal + 0x38) == 0) {
        pcVar4 = "big";
      }
      printf("    Endianness         : %s\n",pcVar4);
      printf("    Storage            : %i bytes/particle\n",
             (ulong)*(uint *)((long)f.internal + 0x78));
      putchar(10);
      return;
    }
    pcVar4 = *(char **)(lVar2 + uVar5 * 8);
    iVar3 = mcpl_hdr_blob(f,pcVar4,&ldata,&data);
    if (iVar3 == 0) break;
    printf("          -> %lu bytes of data with key \"%s\"\n",(ulong)ldata,pcVar4);
    uVar5 = uVar5 + 1;
  }
  mcpl_error("Unexpected blob access error");
}

Assistant:

void mcpl_dump_header(mcpl_file_t f)
{
  printf("\n  Basic info\n");
  printf("    Format             : MCPL-%i\n",mcpl_hdr_version(f));
  printf("    No. of particles   : %" PRIu64 "\n",mcpl_hdr_nparticles(f));
  printf("    Header storage     : %" PRIu64 " bytes\n",mcpl_hdr_header_size(f));
  printf("    Data storage       : %" PRIu64 " bytes\n",mcpl_hdr_nparticles(f)*mcpl_hdr_particle_size(f));
  printf("\n  Custom meta data\n");
  printf("    Source             : \"%s\"\n",mcpl_hdr_srcname(f));
  unsigned nc=mcpl_hdr_ncomments(f);
  printf("    Number of comments : %i\n",nc);
  unsigned ic;
  for (ic = 0; ic < nc; ++ic)
    printf("          -> comment %i : \"%s\"\n",ic,mcpl_hdr_comment(f,ic));
  unsigned nb = mcpl_hdr_nblobs(f);
  printf("    Number of blobs    : %i\n",nb);
  const char** blobkeys = mcpl_hdr_blobkeys(f);
  uint32_t ib;
  for (ib = 0; ib < nb; ++ib) {
    const char * data;
    uint32_t ldata;
    int ok = mcpl_hdr_blob(f, blobkeys[ib], &ldata, &data);
    if (!ok)
      mcpl_error("Unexpected blob access error");
    printf("          -> %lu bytes of data with key \"%s\"\n",(unsigned long)ldata,blobkeys[ib]);
  }

  printf("\n  Particle data format\n");
  printf("    User flags         : %s\n",(mcpl_hdr_has_userflags(f)?"yes":"no"));
  printf("    Polarisation info  : %s\n",(mcpl_hdr_has_polarisation(f)?"yes":"no"));
  printf("    Fixed part. type   : ");
  int32_t updg = mcpl_hdr_universal_pdgcode(f);
  if (updg)
    printf("yes (pdgcode %li)\n",(long)updg);
  else
    printf("no\n");
  printf("    Fixed part. weight : ");
  double uw = mcpl_hdr_universal_weight(f);
  if (uw)
    printf("yes (weight %g)\n",uw);
  else
    printf("no\n");
  printf("    FP precision       : %s\n",(mcpl_hdr_has_doubleprec(f)?"double":"single"));
  printf("    Endianness         : %s\n",(mcpl_hdr_little_endian(f)?"little":"big"));
  printf("    Storage            : %i bytes/particle\n",mcpl_hdr_particle_size(f));

  printf("\n");
}